

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_local_immediate_replace_cloud
          (REF_CLOUD *one_layer,REF_NODE ref_node,REF_CELL ref_cell,REF_DBL *recon,REF_BOOL *replace
          ,REF_INT ldim,REF_INT i)

{
  int iVar1;
  uint uVar2;
  REF_INT local_94;
  REF_DBL local_90;
  REF_INT local_84;
  int local_80;
  REF_DBL RStack_78;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyzs [4];
  REF_GLOB global;
  REF_INT target;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_INT ldim_local;
  REF_BOOL *replace_local;
  REF_DBL *recon_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  REF_CLOUD *one_layer_local;
  
  cell = 0;
  do {
    if (ref_node->max <= cell) {
      return 0;
    }
    if ((((-1 < cell) && (cell < ref_node->max)) && (-1 < ref_node->global[cell])) &&
       (ref_node->ref_mpi->id == ref_node->part[cell])) {
      if ((cell < 0) || (ref_cell->ref_adj->nnode <= cell)) {
        local_80 = -1;
      }
      else {
        local_80 = ref_cell->ref_adj->first[cell];
      }
      cell_node = local_80;
      if (local_80 == -1) {
        local_84 = -1;
      }
      else {
        local_84 = ref_cell->ref_adj->item[local_80].ref;
      }
      target = local_84;
      while (cell_node != -1) {
        for (global._4_4_ = 0; global._4_4_ < ref_cell->node_per; global._4_4_ = global._4_4_ + 1) {
          iVar1 = ref_cell->c2n[global._4_4_ + ref_cell->size_per * target];
          if (replace[i + ldim * iVar1] == 0) {
            if (((iVar1 < 0) || (ref_node->max <= iVar1)) || (ref_node->global[iVar1] < 0)) {
              local_90 = -NAN;
            }
            else {
              local_90 = (REF_DBL)ref_node->global[iVar1];
            }
            xyzs[3] = local_90;
            RStack_78 = ref_node->real[iVar1 * 0xf];
            xyzs[0] = ref_node->real[iVar1 * 0xf + 1];
            xyzs[1] = ref_node->real[iVar1 * 0xf + 2];
            xyzs[2] = recon[i + ldim * iVar1];
            uVar2 = ref_cloud_store(one_layer[cell],(REF_GLOB)local_90,&stack0xffffffffffffff88);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x48e,"ref_recon_local_immediate_replace_cloud",(ulong)uVar2,
                     "store cloud stencil");
              return uVar2;
            }
          }
        }
        cell_node = ref_cell->ref_adj->item[cell_node].next;
        if (cell_node == -1) {
          local_94 = -1;
        }
        else {
          local_94 = ref_cell->ref_adj->item[cell_node].ref;
        }
        target = local_94;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_recon_local_immediate_replace_cloud(
    REF_CLOUD *one_layer, REF_NODE ref_node, REF_CELL ref_cell, REF_DBL *recon,
    REF_BOOL *replace, REF_INT ldim, REF_INT i) {
  REF_INT node, item, cell, cell_node, target;
  REF_GLOB global;
  REF_DBL xyzs[4];
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      each_ref_cell_having_node(ref_cell, node, item, cell) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          target = ref_cell_c2n(ref_cell, cell_node, cell);
          if (!replace[i + ldim * target]) {
            global = ref_node_global(ref_node, target);
            xyzs[0] = ref_node_xyz(ref_node, 0, target);
            xyzs[1] = ref_node_xyz(ref_node, 1, target);
            xyzs[2] = ref_node_xyz(ref_node, 2, target);
            xyzs[3] = recon[i + ldim * target];
            RSS(ref_cloud_store(one_layer[node], global, xyzs),
                "store cloud stencil");
          }
        }
      }
    }
  }
  return REF_SUCCESS;
}